

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void session_reschedule_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  stream->last_writelen = (stream->item->frame).hd.length;
  if ((stream->flags & 0x10) == 0) {
    nghttp2_stream_reschedule(stream);
  }
  else if (session->server != '\0') {
    session_sched_reschedule_stream(session,stream);
  }
  return;
}

Assistant:

static void session_reschedule_stream(nghttp2_session *session,
                                      nghttp2_stream *stream) {
  stream->last_writelen = stream->item->frame.hd.length;

  if (!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES)) {
    nghttp2_stream_reschedule(stream);
    return;
  }

  if (!session->server) {
    return;
  }

  session_sched_reschedule_stream(session, stream);
}